

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  uint uVar1;
  bool bVar2;
  ImVec4 *col;
  ImDrawList *this;
  char *pcVar3;
  ImGuiOldColumns *columns;
  char *pcVar4;
  char *pcVar5;
  ImVec2 *lhs;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *local_80;
  uint local_78;
  int local_54;
  int n;
  ImGuiWindowFlags flags;
  byte local_41;
  uint local_40;
  bool open;
  ImGuiTreeNodeFlags tree_node_flags;
  bool is_active;
  ImGuiContext *g;
  char *label_local;
  ImGuiWindow *window_local;
  
  g = (ImGuiContext *)label;
  label_local = (char *)window;
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
  }
  else {
    _tree_node_flags = GImGui;
    open = (bool)(window->WasActive & 1);
    local_40 = (uint)(window == GImGui->NavWindow);
    if (open == false) {
      col = GetStyleColorVec4(1);
      PushStyleColor(0,col);
    }
    pcVar7 = " *Inactive*";
    if ((open & 1U) != 0) {
      pcVar7 = "";
    }
    local_41 = TreeNodeEx(&g->Initialized,local_40,"%s \'%s\'%s",g,*(undefined8 *)label_local,pcVar7
                         );
    if ((open & 1U) == 0) {
      PopStyleColor(1);
    }
    bVar2 = IsItemHovered(0);
    if ((bVar2) && ((open & 1U) != 0)) {
      this = GetForegroundDrawList((ImGuiWindow *)label_local);
      lhs = (ImVec2 *)(label_local + 0x10);
      _n = operator+(lhs,(ImVec2 *)(label_local + 0x18));
      ImDrawList::AddRect(this,lhs,(ImVec2 *)&n,0xff00ffff,0.0,0xf,1.0);
    }
    if ((local_41 & 1) != 0) {
      if ((label_local[0x3e0] & 1U) != 0) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar1 = *(uint *)(label_local + 0xc);
      DebugNodeDrawList((ImGuiWindow *)label_local,*(ImDrawList **)(label_local + 0x2b8),"DrawList")
      ;
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 (double)*(float *)(label_local + 0x10),(double)*(float *)(label_local + 0x14),
                 (double)*(float *)(label_local + 0x18),(double)*(float *)(label_local + 0x1c),
                 (double)*(float *)(label_local + 0x28),(double)*(float *)(label_local + 0x2c),
                 (double)*(float *)(label_local + 0x30),(double)*(float *)(label_local + 0x34));
      pcVar7 = "";
      if ((uVar1 & 0x1000000) != 0) {
        pcVar7 = "Child ";
      }
      pcVar4 = "";
      if ((uVar1 & 0x2000000) != 0) {
        pcVar4 = "Tooltip ";
      }
      pcVar6 = "";
      if ((uVar1 & 0x4000000) != 0) {
        pcVar6 = "Popup ";
      }
      pcVar8 = "";
      if ((uVar1 & 0x8000000) != 0) {
        pcVar8 = "Modal ";
      }
      pcVar11 = "";
      if ((uVar1 & 0x10000000) != 0) {
        pcVar11 = "ChildMenu ";
      }
      pcVar5 = "";
      if ((uVar1 & 0x100) != 0) {
        pcVar5 = "NoSavedSettings ";
      }
      pcVar10 = "";
      if ((uVar1 & 0x200) != 0) {
        pcVar10 = "NoMouseInputs";
      }
      pcVar9 = "";
      if ((uVar1 & 0x40000) != 0) {
        pcVar9 = "NoNavInputs";
      }
      pcVar3 = "";
      if ((uVar1 & 0x40) != 0) {
        pcVar3 = "AlwaysAutoResize";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar1,pcVar7,pcVar4,pcVar6,pcVar8,
                 pcVar11,pcVar5,pcVar10,pcVar9,pcVar3);
      pcVar7 = "\r\n";
      if ((label_local[0x8c] & 1U) != 0) {
        pcVar7 = "##X";
      }
      pcVar4 = "\r\n";
      if ((label_local[0x8d] & 1U) != 0) {
        pcVar4 = "##Y";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",
                 (double)*(float *)(label_local + 0x5c),(double)*(float *)(label_local + 100),
                 (double)*(float *)(label_local + 0x60),(double)*(float *)(label_local + 0x68),
                 pcVar7 + 2,pcVar4 + 2);
      if (((label_local[0x8e] & 1U) == 0) && ((label_local[0x8f] & 1U) == 0)) {
        local_78 = 0xffffffff;
      }
      else {
        local_78 = (uint)*(short *)(label_local + 0x9e);
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)(label_local[0x8e] & 1),(ulong)(label_local[0x8f] & 1),
                 (ulong)(label_local[0x90] & 1),(ulong)local_78);
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)(label_local[0x94] & 1),(ulong)(label_local[0x95] & 1),
                 (ulong)(uint)(int)label_local[0xac],(ulong)(uint)(int)label_local[0xad],
                 (ulong)(label_local[0x93] & 1),pcVar11,pcVar5,pcVar10,pcVar9,pcVar3);
      BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",
                 (ulong)*(uint *)(label_local + 0x3b0),(ulong)*(uint *)(label_local + 0x3b4),
                 (ulong)*(uint *)(label_local + 0x150));
      if (*(long *)(label_local + 0x3a8) == 0) {
        local_80 = "NULL";
      }
      else {
        local_80 = (char *)**(undefined8 **)(label_local + 0x3a8);
      }
      BulletText("NavLastChildNavWindow: %s",local_80);
      bVar2 = ImRect::IsInverted((ImRect *)(label_local + 0x3b8));
      if (bVar2) {
        BulletText("NavRectRel[0]: <None>");
      }
      else {
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)*(float *)(label_local + 0x3b8),
                   (double)*(float *)(label_local + 0x3bc),(double)*(float *)(label_local + 0x3c0),
                   (double)*(float *)(label_local + 0x3c4));
      }
      if (*(char **)(label_local + 0x390) != label_local) {
        DebugNodeWindow(*(ImGuiWindow **)(label_local + 0x390),"RootWindow");
      }
      if (*(long *)(label_local + 0x388) != 0) {
        DebugNodeWindow(*(ImGuiWindow **)(label_local + 0x388),"ParentWindow");
      }
      if (0 < *(int *)(label_local + 0x198)) {
        DebugNodeWindowsList((ImVector<ImGuiWindow_*> *)(label_local + 0x198),"ChildWindows");
      }
      if ((0 < *(int *)(label_local + 0x2a0)) &&
         (bVar2 = TreeNode("Columns","Columns sets (%d)",(ulong)*(uint *)(label_local + 0x2a0)),
         bVar2)) {
        for (local_54 = 0; local_54 < *(int *)(label_local + 0x2a0); local_54 = local_54 + 1) {
          columns = ImVector<ImGuiOldColumns>::operator[]
                              ((ImVector<ImGuiOldColumns> *)(label_local + 0x2a0),local_54);
          DebugNodeColumns(columns);
        }
        TreePop();
      }
      DebugNodeStorage((ImGuiStorage *)(label_local + 0x290),"Storage");
      TreePop();
    }
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
    BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (!window->NavRectRel[0].IsInverted())
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
    else
        BulletText("NavRectRel[0]: <None>");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}